

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::DOMNormalizer::integerToXMLCh(DOMNormalizer *this,uint i)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *pXVar4;
  long lVar3;
  
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x1e);
  lVar3 = CONCAT44(extraout_var,iVar2);
  *(undefined2 *)(lVar3 + 0xc) = 0;
  pXVar4 = (XMLCh *)(lVar3 + 0xc);
  do {
    pXVar4[-1] = (ushort)(i % 10) | 0x30;
    pXVar4 = pXVar4 + -1;
    bVar1 = 9 < i;
    i = i / 10;
  } while (bVar1);
  pXVar4 = DOMDocumentImpl::getPooledString(this->fDocument,pXVar4);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,lVar3);
  return pXVar4;
}

Assistant:

const XMLCh * DOMNormalizer::integerToXMLCh(unsigned int i) const {
    XMLCh *buf = (XMLCh*) fMemoryManager->allocate(15 * sizeof(XMLCh));//new XMLCh[15];
	XMLCh *pos = buf + sizeof(buf) - sizeof(XMLCh);
	*pos = chNull;

	do {
        switch(i % 10) {
        case 0 : *--pos = chDigit_0;break;
        case 1 : *--pos = chDigit_1;break;
        case 2 : *--pos = chDigit_2;break;
        case 3 : *--pos = chDigit_3;break;
        case 4 : *--pos = chDigit_4;break;
        case 5 : *--pos = chDigit_5;break;
        case 6 : *--pos = chDigit_6;break;
        case 7 : *--pos = chDigit_7;break;
        case 8 : *--pos = chDigit_8;break;
        case 9 : *--pos = chDigit_9;break;
        default:;
        }
		i /= 10;
	} while (i);

    const XMLCh *copy = fDocument->getPooledString(pos);
    fMemoryManager->deallocate(buf);//delete[] buf;
	return copy;
}